

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::syntax_tests::iu_GTestSyntaxTest_x_iutest_x_ExceptionNoThrow_Test::
iu_GTestSyntaxTest_x_iutest_x_ExceptionNoThrow_Test
          (iu_GTestSyntaxTest_x_iutest_x_ExceptionNoThrow_Test *this)

{
  iu_GTestSyntaxTest_x_iutest_x_ExceptionNoThrow_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_GTestSyntaxTest_x_iutest_x_ExceptionNoThrow_Test_0062b2d8;
  return;
}

Assistant:

TEST(GTestSyntaxTest, ExceptionNoThrow)
{
    if( int x = 1 )
        ASSERT_NO_THROW((void)x) << x;
    if( int x = 1 )
        EXPECT_NO_THROW((void)x) << x;
    if( int x = 1 )
        INFORM_NO_THROW((void)x) << x;
    if( int x = 1 )
        ASSUME_NO_THROW((void)x) << x;
}